

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_AtomIsNumericIndex1(JSContext *ctx,JSAtom atom)

{
  int iVar1;
  JSValueUnion ctx_00;
  uint uVar2;
  int iVar3;
  list_head **pplVar5;
  byte bVar6;
  ushort uVar7;
  char cVar8;
  JSRefCountHeader *p;
  JSValue JVar9;
  JSValue JVar10;
  ulong uVar4;
  JSValueUnion p1;
  
  if ((int)atom < 0) {
    return (JSValue)ZEXT416(atom & 0x7fffffff);
  }
  ctx_00 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + atom))->ptr;
  pplVar5 = *(list_head ***)((long)ctx_00.ptr + 4);
  if ((uint)((ulong)pplVar5 >> 0x3e) == 1) {
    uVar2 = (uint)pplVar5 & 0x7fffffff;
    uVar4 = (ulong)uVar2;
    if ((int)(uint)pplVar5 < 0) {
      if (uVar4 == 0) {
LAB_001214dc:
        cVar8 = '\x01';
      }
      else {
        uVar7 = *(ushort *)((long)ctx_00.ptr + 0x10);
        if (uVar7 == 0x2d) {
          uVar7 = *(ushort *)((long)ctx_00.ptr + 0x12);
          pplVar5 = (list_head **)CONCAT71((int7)((ulong)pplVar5 >> 8),uVar7 == 0x30);
          cVar8 = '\x02';
          if (uVar2 != 2 || uVar7 != 0x30) {
            pplVar5 = (list_head **)((long)ctx_00.ptr + 0x12);
            goto LAB_0012148c;
          }
        }
        else {
          pplVar5 = (list_head **)((long)ctx_00.ptr + 0x10);
LAB_0012148c:
          cVar8 = '\0';
          if (uVar7 - 0x3a < 0xfffffff6) {
            if (uVar7 != 0x49) goto LAB_001214dc;
            cVar8 = '\x01';
            if ((long)ctx_00.ptr + ((uVar4 * 2 + 0x10) - (long)pplVar5) == 0x10) {
              cVar8 = pplVar5[1] != (list_head *)0x7900740069006e ||
                      *(long *)((long)pplVar5 + 2) != 0x6e00690066006e;
            }
          }
        }
      }
      if (cVar8 != '\0') {
        if (cVar8 == '\x02') {
LAB_001214ea:
          JVar10.tag = 7;
          JVar10.u.float64 = -0.0;
          return JVar10;
        }
        goto LAB_001214fc;
      }
    }
    else {
      if (uVar4 == 0) goto LAB_001214fc;
      bVar6 = *(byte *)((long)ctx_00.ptr + 0x10);
      if (bVar6 == 0x2d) {
        bVar6 = *(byte *)((long)ctx_00.ptr + 0x11);
        if (uVar2 == 2 && bVar6 == 0x30) goto LAB_001214ea;
        pplVar5 = (list_head **)((long)ctx_00.ptr + 0x11);
      }
      else {
        pplVar5 = (list_head **)((long)ctx_00.ptr + 0x10);
      }
      if (bVar6 - 0x3a < 0xfffffff6) {
        if (bVar6 != 0x49) {
          return (JSValue)(ZEXT816(3) << 0x40);
        }
        if ((long)ctx_00.ptr + ((uVar4 + 0x10) - (long)pplVar5) != 8) {
          return (JSValue)(ZEXT816(3) << 0x40);
        }
        if (*(int *)((long)pplVar5 + 4) != 0x7974696e || *(int *)((long)pplVar5 + 1) != 0x6e69666e)
        goto LAB_001214fc;
      }
    }
    *(int *)ctx_00.ptr = *ctx_00.ptr + 1;
    JVar9.tag = -7;
    JVar9.u.ptr = ctx_00.ptr;
    JVar9 = JS_ToNumberHintFree(ctx,JVar9,(JSToNumberHintEnum)pplVar5);
    JVar10 = JVar9;
    if ((uint)JVar9.tag != 6) {
      JVar10 = JS_ToStringInternal(ctx,JVar9,0);
      p1 = JVar10.u;
      if ((uint)JVar10.tag == 6) {
        if ((0xfffffff4 < (uint)JVar9.tag) &&
           (iVar3 = *JVar9.u.ptr, *(int *)JVar9.u.ptr = iVar3 + -1, iVar3 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar9);
        }
      }
      else {
        iVar3 = js_string_compare((JSContext *)ctx_00.ptr,(JSString *)p1.ptr,(JSString *)JVar10.tag)
        ;
        if ((0xfffffff4 < (uint)JVar10.tag) &&
           (iVar1 = *p1.ptr, *(int *)p1.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar10);
        }
        JVar10 = JVar9;
        if (iVar3 != 0) {
          JS_FreeValue(ctx,JVar9);
          JVar10 = (JSValue)(ZEXT816(3) << 0x40);
        }
      }
    }
  }
  else {
LAB_001214fc:
    JVar10 = (JSValue)(ZEXT816(3) << 0x40);
  }
  return JVar10;
}

Assistant:

static JSValue JS_AtomIsNumericIndex1(JSContext *ctx, JSAtom atom)
{
    JSRuntime *rt = ctx->rt;
    JSAtomStruct *p1;
    JSString *p;
    int c, len, ret;
    JSValue num, str;

    if (__JS_AtomIsTaggedInt(atom))
        return JS_NewInt32(ctx, __JS_AtomToUInt32(atom));
    assert(atom < rt->atom_size);
    p1 = rt->atom_array[atom];
    if (p1->atom_type != JS_ATOM_TYPE_STRING)
        return JS_UNDEFINED;
    p = p1;
    len = p->len;
    if (p->is_wide_char) {
        const uint16_t *r = p->u.str16, *r_end = p->u.str16 + len;
        if (r >= r_end)
            return JS_UNDEFINED;
        c = *r;
        if (c == '-') {
            if (r >= r_end)
                return JS_UNDEFINED;
            r++;
            c = *r;
            /* -0 case is specific */
            if (c == '0' && len == 2)
                goto minus_zero;
        }
        /* XXX: should test NaN, but the tests do not check it */
        if (!is_num(c)) {
            /* XXX: String should be normalized, therefore 8-bit only */
            const uint16_t nfinity16[7] = { 'n', 'f', 'i', 'n', 'i', 't', 'y' };
            if (!(c =='I' && (r_end - r) == 8 &&
                  !memcmp(r + 1, nfinity16, sizeof(nfinity16))))
                return JS_UNDEFINED;
        }
    } else {
        const uint8_t *r = p->u.str8, *r_end = p->u.str8 + len;
        if (r >= r_end)
            return JS_UNDEFINED;
        c = *r;
        if (c == '-') {
            if (r >= r_end)
                return JS_UNDEFINED;
            r++;
            c = *r;
            /* -0 case is specific */
            if (c == '0' && len == 2) {
            minus_zero:
                return __JS_NewFloat64(ctx, -0.0);
            }
        }
        if (!is_num(c)) {
            if (!(c =='I' && (r_end - r) == 8 &&
                  !memcmp(r + 1, "nfinity", 7)))
                return JS_UNDEFINED;
        }
    }
    /* XXX: bignum: would be better to only accept integer to avoid
       relying on current floating point precision */
    /* this is ECMA CanonicalNumericIndexString primitive */
    num = JS_ToNumber(ctx, JS_MKPTR(JS_TAG_STRING, p));
    if (JS_IsException(num))
        return num;
    str = JS_ToString(ctx, num);
    if (JS_IsException(str)) {
        JS_FreeValue(ctx, num);
        return str;
    }
    ret = js_string_compare(ctx, p, JS_VALUE_GET_STRING(str));
    JS_FreeValue(ctx, str);
    if (ret == 0) {
        return num;
    } else {
        JS_FreeValue(ctx, num);
        return JS_UNDEFINED;
    }
}